

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QRenderRule * __thiscall
QHash<unsigned_long_long,_QRenderRule>::operator[]
          (QHash<unsigned_long_long,_QRenderRule> *this,unsigned_long_long *key)

{
  QRenderRule *pQVar1;
  long in_FS_OFFSET;
  unsigned_long_long *in_stack_ffffffffffffffb8;
  QHash<unsigned_long_long,_QRenderRule> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pQVar1 = iterator::operator*((iterator *)0x44b303);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }